

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O2

char * arangodb::velocypack::valueTypeName(ValueType type)

{
  if (type < (Tagged|Illegal)) {
    return &DAT_00112538 + *(int *)(&DAT_00112538 + (ulong)type * 4);
  }
  return "unknown";
}

Assistant:

char const* arangodb::velocypack::valueTypeName(ValueType type) {
  switch (type) {
    case ValueType::None:
      return "none";
    case ValueType::Illegal:
      return "illegal";
    case ValueType::Null:
      return "null";
    case ValueType::Bool:
      return "bool";
    case ValueType::Array:
      return "array";
    case ValueType::Object:
      return "object";
    case ValueType::Double:
      return "double";
    case ValueType::UTCDate:
      return "utc-date";
    case ValueType::External:
      return "external";
    case ValueType::MinKey:
      return "min-key";
    case ValueType::MaxKey:
      return "max-key";
    case ValueType::Int:
      return "int";
    case ValueType::UInt:
      return "uint";
    case ValueType::SmallInt:
      return "smallint";
    case ValueType::String:
      return "string";
    case ValueType::Binary:
      return "binary";
    case ValueType::BCD:
      return "bcd";
    case ValueType::Tagged:
      return "tagged";
    case ValueType::Custom:
      return "custom";
  }

  return "unknown";
}